

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.cpp
# Opt level: O3

bool arangodb::velocypack::Utf8Helper::isValidUtf8(uint8_t *p,ValueLength len)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  
  pbVar3 = p + len;
  bVar2 = 0;
  do {
    if (pbVar3 <= p) {
      return bVar2 == 0;
    }
    bVar1 = *p;
    p = p + 1;
    bVar2 = ::(anonymous_namespace)::states
            [(ulong)(byte)::(anonymous_namespace)::states[bVar1] + (ulong)bVar2 * 0x10 + 0x100];
  } while (bVar2 != 1);
  return false;
}

Assistant:

bool Utf8Helper::isValidUtf8(uint8_t const* p, ValueLength len) {
  uint8_t const* end = p + len;
  uint8_t state = ValidChar;

  while (p < end) {
    state = states[256 + state * 16 + states[*p++]];
    if (state == InvalidChar) {
      return false;
    }
  }

  return (state == ValidChar);
}